

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawGem::Draw(CommandDrawGem *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  int iVar1;
  FTexture *this_00;
  FTexture *texture;
  SBarInfoCoordinate y;
  uint uVar2;
  
  this_00 = FImageCollection::operator[](&statusBar->Images,this->chain);
  texture = FImageCollection::operator[](&statusBar->Images,this->gem);
  if (this_00 != (FTexture *)0x0) {
    y = this->y;
    if ((this->wiggle == true) && (this->drawValue != this->goalValue)) {
      y = (SBarInfoCoordinate)((int)y + this->chainWiggle * 2);
    }
    iVar1 = FTexture::GetScaledWidth(this_00);
    uVar2 = (uint)((double)this->drawValue *
                  ((double)(iVar1 - (this->leftPadding + this->rightPadding)) / 100.0));
    DSBarInfo::DrawGraphic
              (statusBar,this_00,(SBarInfoCoordinate)((uVar2 % this->chainSize) * 2 + (int)this->x),
               y,block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets,false,
               false,0);
    if (texture != (FTexture *)0x0) {
      DSBarInfo::DrawGraphic
                (statusBar,texture,
                 (SBarInfoCoordinate)((uVar2 + this->leftPadding) * 2 + (int)this->x),y,
                 block->xOffset,block->yOffset,block->currentAlpha,block->fullScreenOffsets,
                 this->translatable,false,0);
    }
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			FTexture *chainImg = statusBar->Images[chain];
			FTexture *gemImg = statusBar->Images[gem];
			if(chainImg == NULL)
				return;
		
			SBarInfoCoordinate drawY = y;
			if(wiggle && drawValue != goalValue) // Should only wiggle when the value doesn't equal what is being drawn.
				drawY += chainWiggle;
			int chainWidth = chainImg->GetScaledWidth();
			int offset = (int) (((double) (chainWidth-leftPadding-rightPadding)/100)*drawValue);
			statusBar->DrawGraphic(chainImg, x+(offset%chainSize), drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets());
			if(gemImg != NULL)
				statusBar->DrawGraphic(gemImg, x+leftPadding+offset, drawY, block->XOffset(), block->YOffset(), block->Alpha(), block->FullScreenOffsets(), translatable);
		}